

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void WriteVarInt<DataStream,(VarIntMode)0,unsigned_long>(DataStream *os,unsigned_long n)

{
  ulong uVar1;
  long in_FS_OFFSET;
  bool bVar2;
  uchar tmp [10];
  byte local_33;
  byte local_32 [10];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_32[0] = (byte)n & 0x7f;
  if (n < 0x80) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      n = (n >> 7) - 1;
      local_32[uVar1 + 1] = (byte)n | 0x80;
      uVar1 = uVar1 + 1;
    } while (0x7f < n);
    uVar1 = uVar1 & 0xffffffff;
  }
  do {
    local_33 = local_32[uVar1];
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os,
               (os->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_33,local_32);
    bVar2 = uVar1 != 0;
    uVar1 = uVar1 - 1;
  } while (bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteVarInt(Stream& os, I n)
{
    CheckVarIntMode<Mode, I>();
    unsigned char tmp[(sizeof(n)*8+6)/7];
    int len=0;
    while(true) {
        tmp[len] = (n & 0x7F) | (len ? 0x80 : 0x00);
        if (n <= 0x7F)
            break;
        n = (n >> 7) - 1;
        len++;
    }
    do {
        ser_writedata8(os, tmp[len]);
    } while(len--);
}